

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool __thiscall ImGuiListClipper::Step(ImGuiListClipper *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  ImGuiWindow *pIVar4;
  bool bVar5;
  ImGuiWindow *window;
  
  iVar3 = this->ItemsCount;
  if ((iVar3 == 0) || (pIVar4 = GImGui->CurrentWindow, pIVar4->SkipItems == true)) {
LAB_0011e612:
    this->ItemsCount = -1;
    goto switchD_0011e634_default;
  }
  switch(this->StepNo) {
  case 0:
    this->DisplayStart = 0;
    this->DisplayEnd = 1;
    this->StartPosY = ((pIVar4->DC).CursorPos.y - (pIVar4->Pos).y) + (pIVar4->Scroll).y;
    this->StepNo = 1;
    goto LAB_0011e6a1;
  case 1:
    if (iVar3 == 1) goto LAB_0011e612;
    Begin(this,iVar3 + -1,
          (((pIVar4->DC).CursorPos.y - (pIVar4->Pos).y) + (pIVar4->Scroll).y) - this->StartPosY);
    uVar1 = this->DisplayStart;
    uVar2 = this->DisplayEnd;
    this->DisplayStart = uVar1 + 1;
    this->DisplayEnd = uVar2 + 1;
  case 2:
    this->StepNo = 3;
LAB_0011e6a1:
    bVar5 = true;
    break;
  case 3:
    End(this);
  default:
switchD_0011e634_default:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ImGuiListClipper::Step()
{
    if (ItemsCount == 0 || ImGui::GetCurrentWindowRead()->SkipItems)
    {
        ItemsCount = -1;
        return false;
    }
    if (StepNo == 0) // Step 0: the clipper let you process the first element, regardless of it being visible or not, so we can measure the element height.
    {
        DisplayStart = 0;
        DisplayEnd = 1;
        StartPosY = ImGui::GetCursorPosY();
        StepNo = 1;
        return true;
    }
    if (StepNo == 1) // Step 1: the clipper infer height from first element, calculate the actual range of elements to display, and position the cursor before the first element.
    {
        if (ItemsCount == 1) { ItemsCount = -1; return false; }
        float items_height = ImGui::GetCursorPosY() - StartPosY;
        IM_ASSERT(items_height > 0.0f);   // If this triggers, it means Item 0 hasn't moved the cursor vertically
        Begin(ItemsCount-1, items_height);
        DisplayStart++;
        DisplayEnd++;
        StepNo = 3;
        return true;
    }
    if (StepNo == 2) // Step 2: dummy step only required if an explicit items_height was passed to constructor or Begin() and user still call Step(). Does nothing and switch to Step 3.
    {
        IM_ASSERT(DisplayStart >= 0 && DisplayEnd >= 0);
        StepNo = 3;
        return true;
    }
    if (StepNo == 3) // Step 3: the clipper validate that we have reached the expected Y position (corresponding to element DisplayEnd), advance the cursor to the end of the list and then returns 'false' to end the loop.
        End();
    return false;
}